

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::text_format_unittest::TextFormatTest_ParseWithTrailingComma_Test::TestBody
          (TextFormatTest_ParseWithTrailingComma_Test *this)

{
  bool bVar1;
  char *pcVar2;
  Message *in_RCX;
  char *in_R9;
  string_view input;
  string_view input_00;
  string_view input_01;
  string_view input_02;
  string local_180;
  AssertHelper local_160;
  Message local_158;
  basic_string_view<char,_std::char_traits<char>_> local_150;
  bool local_139;
  undefined1 local_138 [8];
  AssertionResult gtest_ar__3;
  AssertHelper local_108;
  Message local_100;
  basic_string_view<char,_std::char_traits<char>_> local_f8;
  bool local_e1;
  undefined1 local_e0 [8];
  AssertionResult gtest_ar__2;
  AssertHelper local_b0;
  Message local_a8;
  basic_string_view<char,_std::char_traits<char>_> local_a0;
  bool local_89;
  undefined1 local_88 [8];
  AssertionResult gtest_ar__1;
  AssertHelper local_58;
  Message local_50 [3];
  basic_string_view<char,_std::char_traits<char>_> local_38;
  bool local_21;
  undefined1 local_20 [8];
  AssertionResult gtest_ar_;
  TextFormatTest_ParseWithTrailingComma_Test *this_local;
  
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )this;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_38,"optional_int32: 456 ,\n");
  input._M_str = &(this->super_TextFormatTest).super_TextFormatTestBase.proto_;
  input._M_len = (size_t)local_38._M_str;
  local_21 = TextFormat::ParseFromString((TextFormat *)local_38._M_len,input,in_RCX);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_20,&local_21,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_20);
  if (!bVar1) {
    testing::Message::Message(local_50);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__1.message_,(internal *)local_20,
               (AssertionResult *)
               "TextFormat::ParseFromString(\"optional_int32: 456 ,\\n\", &proto_)","false","true",
               in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    in_RCX = (Message *)0x540;
    testing::internal::AssertHelper::AssertHelper
              (&local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/text_format_unittest.cc"
               ,0x540,pcVar2);
    testing::internal::AssertHelper::operator=(&local_58,local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_58);
    std::__cxx11::string::~string((string *)&gtest_ar__1.message_);
    testing::Message::~Message(local_50);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_20);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_a0,"optional_foreign_enum: FOREIGN_FOO ,");
  input_00._M_str = &(this->super_TextFormatTest).super_TextFormatTestBase.proto_;
  input_00._M_len = (size_t)local_a0._M_str;
  local_89 = TextFormat::ParseFromString((TextFormat *)local_a0._M_len,input_00,in_RCX);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_88,&local_89,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_88);
  if (!bVar1) {
    testing::Message::Message(&local_a8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__2.message_,(internal *)local_88,
               (AssertionResult *)
               "TextFormat::ParseFromString( \"optional_foreign_enum: FOREIGN_FOO ,\", &proto_)",
               "false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    in_RCX = (Message *)0x542;
    testing::internal::AssertHelper::AssertHelper
              (&local_b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/text_format_unittest.cc"
               ,0x542,pcVar2);
    testing::internal::AssertHelper::operator=(&local_b0,&local_a8);
    testing::internal::AssertHelper::~AssertHelper(&local_b0);
    std::__cxx11::string::~string((string *)&gtest_ar__2.message_);
    testing::Message::~Message(&local_a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_88);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_f8,"repeated_string: [ \"foo\" ] ,");
  input_01._M_str = &(this->super_TextFormatTest).super_TextFormatTestBase.proto_;
  input_01._M_len = (size_t)local_f8._M_str;
  local_e1 = TextFormat::ParseFromString((TextFormat *)local_f8._M_len,input_01,in_RCX);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_e0,&local_e1,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e0);
  if (!bVar1) {
    testing::Message::Message(&local_100);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__3.message_,(internal *)local_e0,
               (AssertionResult *)
               "TextFormat::ParseFromString(\"repeated_string: [ \\\"foo\\\" ] ,\", &proto_)",
               "false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    in_RCX = (Message *)0x544;
    testing::internal::AssertHelper::AssertHelper
              (&local_108,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/text_format_unittest.cc"
               ,0x544,pcVar2);
    testing::internal::AssertHelper::operator=(&local_108,&local_100);
    testing::internal::AssertHelper::~AssertHelper(&local_108);
    std::__cxx11::string::~string((string *)&gtest_ar__3.message_);
    testing::Message::~Message(&local_100);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_e0);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_150,"repeated_nested_message: [ { bb: 1 , } ]");
  input_02._M_str = &(this->super_TextFormatTest).super_TextFormatTestBase.proto_;
  input_02._M_len = (size_t)local_150._M_str;
  local_139 = TextFormat::ParseFromString((TextFormat *)local_150._M_len,input_02,in_RCX);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_138,&local_139,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_138);
  if (!bVar1) {
    testing::Message::Message(&local_158);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_180,(internal *)local_138,
               (AssertionResult *)
               "TextFormat::ParseFromString( \"repeated_nested_message: [ { bb: 1 , } ]\", &proto_)"
               ,"false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_160,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/text_format_unittest.cc"
               ,0x546,pcVar2);
    testing::internal::AssertHelper::operator=(&local_160,&local_158);
    testing::internal::AssertHelper::~AssertHelper(&local_160);
    std::__cxx11::string::~string((string *)&local_180);
    testing::Message::~Message(&local_158);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_138);
  return;
}

Assistant:

TEST_F(TextFormatTest, ParseWithTrailingComma) {
  EXPECT_TRUE(TextFormat::ParseFromString("optional_int32: 456 ,\n", &proto_));
  EXPECT_TRUE(TextFormat::ParseFromString(
      "optional_foreign_enum: FOREIGN_FOO ,", &proto_));
  EXPECT_TRUE(
      TextFormat::ParseFromString("repeated_string: [ \"foo\" ] ,", &proto_));
  EXPECT_TRUE(TextFormat::ParseFromString(
      "repeated_nested_message: [ { bb: 1 , } ]", &proto_));
}